

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_filter_test.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  undefined4 *puVar3;
  runtime_error *prVar4;
  string asStack_508 [32];
  copy_filter flt;
  ostringstream oss;
  ostringstream ss;
  string local_198 [368];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"- Normal flow");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  std::operator<<((ostream *)&ss,"a");
  cppcms::copy_filter::copy_filter(&flt,(ostream *)&ss);
  std::operator<<((ostream *)&ss,"bc");
  cppcms::copy_filter::detach_abi_cxx11_();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "bc");
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/copy_filter_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x16);
    std::operator<<(poVar2," flt.detach()==\"bc\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,asStack_508);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::operator<<((ostream *)&ss,"d");
  cppcms::copy_filter::~copy_filter(&flt);
  std::operator<<((ostream *)&ss,"e");
  std::__cxx11::stringbuf::str();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flt,
                          "abcde");
  std::__cxx11::string::~string((string *)&flt);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&flt);
    poVar2 = std::operator<<((ostream *)&flt,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/copy_filter_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1a);
    std::operator<<(poVar2," ss.str()==\"abcde\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&oss);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"- With Flush");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ios::clear((int)(ostream *)&ss + (int)*(undefined8 *)(_ss + -0x18));
  std::__cxx11::string::string((string *)&flt,"",(allocator *)&oss);
  std::__cxx11::stringbuf::str(local_198);
  std::__cxx11::string::~string((string *)&flt);
  std::operator<<((ostream *)&ss,"a");
  cppcms::copy_filter::copy_filter(&flt,(ostream *)&ss);
  std::operator<<((ostream *)&ss,"b");
  std::ostream::flush();
  std::operator<<((ostream *)&ss,"c");
  cppcms::copy_filter::detach_abi_cxx11_();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "bc");
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/copy_filter_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x24);
    std::operator<<(poVar2," flt.detach()==\"bc\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,asStack_508);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::copy_filter::~copy_filter(&flt);
  std::operator<<((ostream *)&ss,"d");
  std::__cxx11::stringbuf::str();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flt,
                          "abcd");
  std::__cxx11::string::~string((string *)&flt);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"- With throw and flush");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ios::clear((int)(ostream *)&ss + (int)*(undefined8 *)(_ss + -0x18));
    std::__cxx11::string::string((string *)&flt,"",(allocator *)&oss);
    std::__cxx11::stringbuf::str(local_198);
    std::__cxx11::string::~string((string *)&flt);
    std::operator<<((ostream *)&ss,"a");
    cppcms::copy_filter::copy_filter(&flt,(ostream *)&ss);
    std::operator<<((ostream *)&ss,"b");
    std::ostream::flush();
    puVar3 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar3 = 1;
    __cxa_throw(puVar3,&int::typeinfo,0);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&flt);
  poVar2 = std::operator<<((ostream *)&flt,"Error ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/copy_filter_test.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x27);
  std::operator<<(poVar2," ss.str()==\"abcd\"");
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar4,(string *)&oss);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	try {
		std::cout << "- Normal flow" << std::endl;
		std::ostringstream ss;
		ss << "a";
		{
			cppcms::copy_filter flt(ss);
			ss << "bc";
			TEST(flt.detach()=="bc");
			ss << "d";
		}
		ss << "e";
		TEST(ss.str()=="abcde");
		std::cout << "- With Flush" << std::endl;
		ss.clear();
		ss.str("");
		ss << "a";
		{
			cppcms::copy_filter flt(ss);
			ss << "b";
			ss << std::flush;
			ss << "c";
			TEST(flt.detach()=="bc");
		}
		ss << "d";
		TEST(ss.str()=="abcd");
		std::cout << "- With throw and flush" << std::endl;
		ss.clear();
		ss.str("");
		ss << "a";
		try {
			cppcms::copy_filter flt(ss);
			ss << "b";
			ss << std::flush;
			throw int(1);
		}
		catch(int x){}
		ss << "c";
		TEST(ss.str()=="abc");
		std::cout << "- With throw and no flush" << std::endl;
		ss.clear();
		ss.str("");
		ss << "a";
		try {
			cppcms::copy_filter flt(ss);
			ss << "b";
			throw int(1);
		}
		catch(int x){}
		ss << "c";
		TEST(ss.str()=="ac");

	}
	catch(std::exception const &e) {
		std::cerr << "Fail:" << e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;

}